

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoQuad>::SideIsUndefined
          (TPZGeoElRefLess<pzgeom::TPZGeoQuad> *this,int side)

{
  int iVar1;
  ostream *poVar2;
  
  if (-1 < side) {
    iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0xf0))(this);
    if (side <= iVar1) {
      return (int)(this->fNeighbours[side].fGeoElIndex == -1 || this->fNeighbours[side].fSide == -1)
      ;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "TPZGeoElRefLess<TGeo>::SideIsUndefined - bad side: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,side);
  std::endl<char,std::char_traits<char>>(poVar2);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
             ,0xcd);
}

Assistant:

int
TPZGeoElRefLess<TGeo>::SideIsUndefined(int side){
	if (side < 0 || side > NSides()){
		PZError << "TPZGeoElRefLess<TGeo>::SideIsUndefined - bad side: " << side << std::endl;
        DebugStop();
	}
	return (fNeighbours[side].Side() == -1);
}